

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
visit_begin_array(basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_> *this,
                 semantic_tag param_2,ser_context *param_3,error_code *ec)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  iterator value;
  reference result;
  long in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>,_bool>
  pVar4;
  string_type str_1;
  string_type str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item;
  iterator __end0;
  iterator __begin0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  size_t index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  undefined4 in_stack_fffffffffffffe48;
  csv_errc in_stack_fffffffffffffe4c;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
  *in_stack_fffffffffffffef0;
  string local_a8 [48];
  string local_78 [32];
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  long local_40;
  long local_38;
  undefined4 local_30;
  undefined4 local_2c;
  
  bVar1 = std::
          vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
          ::empty((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                   *)in_stack_fffffffffffffe50._M_cur);
  if (bVar1) {
    if ((*(byte *)(in_RDI + 0x40) & 1) == 0) {
      local_30 = 1;
      std::
      vector<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item,std::allocator<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item>>
      ::
      emplace_back<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item_kind>
                ((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                  *)in_stack_fffffffffffffe50._M_cur,
                 (stack_item_kind *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    }
    else {
      local_2c = 0;
      std::
      vector<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item,std::allocator<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item>>
      ::
      emplace_back<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item_kind>
                ((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                  *)in_stack_fffffffffffffe50._M_cur,
                 (stack_item_kind *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    }
  }
  else {
    sVar2 = std::
            vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
            ::size((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                    *)(in_RDI + 0x170));
    if (sVar2 < *(ulong *)(in_RDI + 0x48)) {
      if ((((*(byte *)(in_RDI + 0x51) & 1) != 0) &&
          (pvVar3 = std::
                    vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                    ::back((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                            *)in_stack_fffffffffffffe40), pvVar3->count_ == 0)) &&
         ((pvVar3 = std::
                    vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                    ::back((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                            *)in_stack_fffffffffffffe40), pvVar3->item_kind_ == flat_row_mapping ||
          (pvVar3 = std::
                    vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                    ::back((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                            *)in_stack_fffffffffffffe40), pvVar3->item_kind_ == row_mapping)))) {
        local_38 = 0;
        local_40 = in_RDI + 0x1b8;
        local_48._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(in_stack_fffffffffffffe38);
        value = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(in_stack_fffffffffffffe38);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_fffffffffffffe40,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_fffffffffffffe38), bVar1) {
          result = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_48);
          std::__cxx11::string::string(local_78,(allocator *)(in_RDI + 0x168));
          std::__cxx11::string::push_back((char)local_78);
          jsoncons::detail::from_integer<unsigned_long,std::__cxx11::string>
                    ((unsigned_long)value._M_current,result);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string&>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffe50._M_cur,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          std::__cxx11::string::string(local_a8,(allocator *)(in_RDI + 0x168));
          std::
          unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::emplace<std::__cxx11::string&,std::__cxx11::string>
                    ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffe50._M_cur,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                     in_stack_fffffffffffffe40);
          std::__cxx11::string::~string(local_a8);
          std::
          unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::emplace<std::__cxx11::string,std::__cxx11::string_const&>
                    ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffe50._M_cur,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                     in_stack_fffffffffffffe40);
          local_38 = local_38 + 1;
          std::__cxx11::string::~string(local_78);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_48);
        }
        *(undefined1 *)(in_RDI + 0x50) = 1;
      }
      pvVar3 = std::
               vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
               ::back((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                       *)in_stack_fffffffffffffe40);
      switch(pvVar3->item_kind_) {
      case flat_row_mapping:
        if ((*(byte *)(in_RDI + 0x50) & 1) == 0) {
          std::
          vector<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item,std::allocator<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item>>
          ::
          emplace_back<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item_kind>
                    ((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                      *)in_stack_fffffffffffffe50._M_cur,
                     (stack_item_kind *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        }
        else {
          std::
          vector<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item,std::allocator<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item>>
          ::
          emplace_back<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item_kind>
                    ((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                      *)in_stack_fffffffffffffe50._M_cur,
                     (stack_item_kind *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        }
        break;
      case row_mapping:
        std::
        vector<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item,std::allocator<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item>>
        ::
        emplace_back<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item_kind>
                  ((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                    *)in_stack_fffffffffffffe50._M_cur,
                   (stack_item_kind *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
        ;
        break;
      case flat_object:
        if (*(char *)(in_RDI + 0x53) == '\0') {
          std::
          vector<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item,std::allocator<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item>>
          ::
          emplace_back<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item_kind>
                    ((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                      *)in_stack_fffffffffffffe50._M_cur,
                     (stack_item_kind *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        }
        else {
          pvVar3 = std::
                   vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                   ::operator[]((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                                 *)(in_RDI + 0x170),0);
          if ((pvVar3->count_ == 0) && ((*(byte *)(in_RDI + 0x50) & 1) == 0)) {
            pvVar3 = std::
                     vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                     ::back((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                             *)in_stack_fffffffffffffe40);
            std::__cxx11::string::string
                      ((string *)&stack0xfffffffffffffef0,(string *)&pvVar3->column_path_);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string&>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffe50._M_cur,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
            __args_1 = &local_130;
            std::__cxx11::string::string((string *)__args_1,(allocator *)(in_RDI + 0x168));
            pVar4 = std::
                    unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    ::emplace<std::__cxx11::string,std::__cxx11::string>
                              ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)in_stack_fffffffffffffe50._M_cur,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                               __args_1);
            in_stack_fffffffffffffe50._M_cur =
                 (__node_type *)
                 pVar4.first.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                 ._M_cur;
            in_stack_fffffffffffffe4c = CONCAT13(pVar4.second,(int3)in_stack_fffffffffffffe4c);
            std::__cxx11::string::~string((string *)&local_130);
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
          }
          std::__cxx11::string::clear();
          std::
          vector<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item,std::allocator<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item>>
          ::
          emplace_back<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item_kind>
                    ((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                      *)in_stack_fffffffffffffe50._M_cur,
                     (stack_item_kind *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        }
        break;
      case flat_row:
        if (*(char *)(in_RDI + 0x53) == '\0') {
          std::
          vector<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item,std::allocator<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item>>
          ::
          emplace_back<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item_kind>
                    ((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                      *)in_stack_fffffffffffffe50._M_cur,
                     (stack_item_kind *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        }
        else {
          append_array_path_component(in_stack_fffffffffffffef0);
          std::__cxx11::string::clear();
          std::
          vector<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item,std::allocator<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item>>
          ::
          emplace_back<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item_kind>
                    ((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                      *)in_stack_fffffffffffffe50._M_cur,
                     (stack_item_kind *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        }
        break;
      case stream_flat_row:
        if (*(char *)(in_RDI + 0x53) == '\0') {
          std::
          vector<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item,std::allocator<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item>>
          ::
          emplace_back<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item_kind>
                    ((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                      *)in_stack_fffffffffffffe50._M_cur,
                     (stack_item_kind *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        }
        else {
          std::__cxx11::string::clear();
          std::
          vector<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item,std::allocator<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item>>
          ::
          emplace_back<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item_kind>
                    ((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                      *)in_stack_fffffffffffffe50._M_cur,
                     (stack_item_kind *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        }
        break;
      case unmapped:
        std::
        vector<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item,std::allocator<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item>>
        ::
        emplace_back<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item_kind>
                  ((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                    *)in_stack_fffffffffffffe50._M_cur,
                   (stack_item_kind *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
        ;
        break;
      case object:
        std::
        vector<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item,std::allocator<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item>>
        ::
        emplace_back<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item_kind>
                  ((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                    *)in_stack_fffffffffffffe50._M_cur,
                   (stack_item_kind *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
        ;
        break;
      case row:
        std::
        vector<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item,std::allocator<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item>>
        ::
        emplace_back<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item_kind>
                  ((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                    *)in_stack_fffffffffffffe50._M_cur,
                   (stack_item_kind *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
        ;
        break;
      case column_mapping:
        std::
        vector<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item,std::allocator<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item>>
        ::
        emplace_back<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item_kind>
                  ((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                    *)in_stack_fffffffffffffe50._M_cur,
                   (stack_item_kind *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
        ;
        break;
      case column:
        std::__cxx11::string::clear();
        std::
        vector<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item,std::allocator<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item>>
        ::
        emplace_back<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item_kind>
                  ((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                    *)in_stack_fffffffffffffe50._M_cur,
                   (stack_item_kind *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
        ;
        break;
      case multivalued_field:
      case stream_multivalued_field:
        std::
        vector<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item,std::allocator<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item>>
        ::
        emplace_back<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item_kind>
                  ((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                    *)in_stack_fffffffffffffe50._M_cur,
                   (stack_item_kind *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
        ;
        break;
      case column_multivalued_field:
        std::
        vector<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item,std::allocator<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item>>
        ::
        emplace_back<jsoncons::csv::basic_csv_encoder<char,jsoncons::stream_sink<char>,std::allocator<char>>::stack_item_kind>
                  ((vector<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::stack_item>_>
                    *)in_stack_fffffffffffffe50._M_cur,
                   (stack_item_kind *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
        ;
        break;
      default:
        std::error_code::operator=
                  ((error_code *)in_stack_fffffffffffffe50._M_cur,in_stack_fffffffffffffe4c);
      }
    }
    else {
      std::error_code::operator=
                ((error_code *)in_stack_fffffffffffffe50._M_cur,in_stack_fffffffffffffe4c);
    }
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_begin_array(semantic_tag, const ser_context&, std::error_code& ec) override
    {
        if (stack_.empty())
        {
            if (flat_)
            {
                stack_.emplace_back(stack_item_kind::flat_row_mapping);
            }
            else
            {
                stack_.emplace_back(stack_item_kind::row_mapping);
            }
            JSONCONS_VISITOR_RETURN;
        }
        if (JSONCONS_UNLIKELY(stack_.size() >= max_nesting_depth_))
        {
            ec = csv_errc::max_nesting_depth_exceeded;
            JSONCONS_VISITOR_RETURN;
        }
        // legacy        
        if (has_column_names_ && stack_.back().count_ == 0)
        {
            if (stack_.back().item_kind_ == stack_item_kind::flat_row_mapping || stack_.back().item_kind_ == stack_item_kind::row_mapping)
            {
                std::size_t index = 0;
                for (const auto& item : column_names_)
                {
                    string_type str{alloc_};
                    str.push_back('/');
                    jsoncons::detail::from_integer(index, str);
                    column_paths_.emplace_back(str);
                    column_path_value_map_.emplace(str, string_type{alloc_});
                    column_path_name_map_.emplace(std::move(str), item);
                    ++index;
                }
                has_column_mapping_ = true;
            }
        }
        
        switch (stack_.back().item_kind_)
        {
            case stack_item_kind::flat_row_mapping:
                if (has_column_mapping_)
                {
                    stack_.emplace_back(stack_item_kind::flat_row);
                }
                else
                {
                    stack_.emplace_back(stack_item_kind::stream_flat_row);
                }
                break;
            case stack_item_kind::row_mapping:
                stack_.emplace_back(stack_item_kind::row);
                break;
            case stack_item_kind::object:
                stack_.emplace_back(stack_item_kind::object);
                break;
            case stack_item_kind::row:
                stack_.emplace_back(stack_item_kind::row);
                break;
            case stack_item_kind::flat_row:
                if (subfield_delimiter_ == char_type())
                {
                    stack_.emplace_back(stack_item_kind::unmapped);
                }
                else
                {
                    append_array_path_component();
                    value_buffer_.clear();
                    stack_.emplace_back(stack_item_kind::multivalued_field);
                }
                break;
            case stack_item_kind::stream_flat_row:
                if (subfield_delimiter_ == char_type())
                {
                    stack_.emplace_back(stack_item_kind::unmapped);
                }
                else
                {
                    value_buffer_.clear();
                    stack_.emplace_back(stack_item_kind::stream_multivalued_field);
                }
                break;
            case stack_item_kind::flat_object:
                if (subfield_delimiter_ == char_type())
                {
                    stack_.emplace_back(stack_item_kind::unmapped);
                }
                else
                {
                    if (stack_[0].count_ == 0)
                    {
                        if (!has_column_mapping_)
                        {
                            string_type str = stack_.back().column_path_;
                            column_paths_.emplace_back(str);
                            column_path_value_map_.emplace(std::move(str), string_type{alloc_});
                        }
                    }
                    
                    value_buffer_.clear();
                    stack_.emplace_back(stack_item_kind::multivalued_field);
                }
                break;
            case stack_item_kind::multivalued_field:
            case stack_item_kind::stream_multivalued_field:
                stack_.emplace_back(stack_item_kind::unmapped);
                break;
            case stack_item_kind::column_mapping:
                stack_.emplace_back(stack_item_kind::column);
                break;
            case stack_item_kind::column:
            {
                value_buffer_.clear();
                stack_.emplace_back(stack_item_kind::column_multivalued_field);
                break;
            }
            case stack_item_kind::column_multivalued_field:
                stack_.emplace_back(stack_item_kind::unmapped);
                break;
            case stack_item_kind::unmapped:
                stack_.emplace_back(stack_item_kind::unmapped);
                break;
            default: // error
                //std::cout << "visit_begin_array " << (int)stack_.back().item_kind_ << "\n"; 
                ec = csv_errc::source_error;
                JSONCONS_VISITOR_RETURN;
        }
        JSONCONS_VISITOR_RETURN;
    }